

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O1

bool __thiscall Quest_Context::TalkedNPC(Quest_Context *this,char vendor_id)

{
  bool bVar1;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  string local_40;
  
  if ((this->quest->quest->info).disabled == false) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"talkedtonpc","");
    local_68._8_8_ = 0;
    local_68._1_7_ = 0;
    local_68._M_pod_data[0] = vendor_id;
    pcStack_50 = std::
                 _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GabrielLins64[P]custom-eoserv/tu/../src/quest.cpp:1049:42)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/GabrielLins64[P]custom-eoserv/tu/../src/quest.cpp:1049:42)>
               ::_M_manager;
    bVar1 = EOPlus::Context::TriggerRule
                      (&this->super_Context,&local_40,
                       (function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>
                        *)&local_68);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Quest_Context::TalkedNPC(char vendor_id)
{
	if (this->quest->Disabled())
		return false;

	return this->TriggerRule("talkedtonpc", [vendor_id](const std::deque<util::variant>& args) { return int(args[0]) == vendor_id; });
}